

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O3

anon_class_136_17_7d744f41_conflict * __thiscall
qclab::qgates::lambda_QGate2<std::complex<float>>
          (anon_class_136_17_7d744f41_conflict *__return_storage_ptr__,qgates *this,Op op,
          SquareMatrix<std::complex<float>_> *mat2,complex<float> *vector)

{
  long lVar1;
  complex<float> *pcVar2;
  _ComplexT _Var3;
  _ComplexT _Var4;
  _ComplexT _Var5;
  _ComplexT _Var6;
  _ComplexT _Var7;
  _ComplexT _Var8;
  _ComplexT _Var9;
  _ComplexT _Var10;
  _ComplexT _Var11;
  _ComplexT _Var12;
  _ComplexT _Var13;
  _ComplexT _Var14;
  _ComplexT _Var15;
  _ComplexT _Var16;
  _ComplexT _Var17;
  _ComplexT _Var18;
  undefined7 in_register_00000011;
  SquareMatrix<std::complex<float>_> *A;
  
  A = (SquareMatrix<std::complex<float>_> *)CONCAT71(in_register_00000011,op);
  if (A->size_ == 4) {
    dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>((Op)this,A);
    lVar1 = A->size_;
    pcVar2 = (A->data_)._M_t.
             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
    _Var3 = pcVar2[lVar1]._M_value;
    _Var4 = (pcVar2 + 1)[lVar1]._M_value;
    _Var5 = (pcVar2 + 2)[lVar1]._M_value;
    _Var6 = (pcVar2 + 3)[lVar1]._M_value;
    _Var7 = pcVar2[lVar1 * 2]._M_value;
    _Var8 = (pcVar2 + 1)[lVar1 * 2]._M_value;
    _Var9 = pcVar2[lVar1 * 3]._M_value;
    _Var10 = (pcVar2 + 1)[lVar1 * 3]._M_value;
    _Var11 = (pcVar2 + 2)[lVar1 * 2]._M_value;
    _Var12 = (pcVar2 + 2)[lVar1 * 3]._M_value;
    _Var13 = (pcVar2 + 3)[lVar1 * 2]._M_value;
    _Var14 = (pcVar2 + 3)[lVar1 * 3]._M_value;
    _Var15 = pcVar2->_M_value;
    _Var16 = pcVar2[1]._M_value;
    _Var17 = pcVar2[2]._M_value;
    _Var18 = pcVar2[3]._M_value;
    __return_storage_ptr__->vector = (complex<float> *)mat2;
    (__return_storage_ptr__->m11)._M_value = _Var15;
    (__return_storage_ptr__->m12)._M_value = _Var3;
    (__return_storage_ptr__->m13)._M_value = _Var7;
    (__return_storage_ptr__->m14)._M_value = _Var9;
    (__return_storage_ptr__->m21)._M_value = _Var16;
    (__return_storage_ptr__->m22)._M_value = _Var4;
    (__return_storage_ptr__->m23)._M_value = _Var8;
    (__return_storage_ptr__->m24)._M_value = _Var10;
    (__return_storage_ptr__->m31)._M_value = _Var17;
    (__return_storage_ptr__->m32)._M_value = _Var5;
    (__return_storage_ptr__->m33)._M_value = _Var11;
    (__return_storage_ptr__->m34)._M_value = _Var12;
    (__return_storage_ptr__->m41)._M_value = _Var18;
    (__return_storage_ptr__->m42)._M_value = _Var6;
    (__return_storage_ptr__->m43)._M_value = _Var13;
    (__return_storage_ptr__->m44)._M_value = _Var14;
    return __return_storage_ptr__;
  }
  __assert_fail("mat2.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xae,
                "auto qclab::qgates::lambda_QGate2(Op, qclab::dense::SquareMatrix<T>, T *) [T = std::complex<float>]"
               );
}

Assistant:

auto lambda_QGate2( Op op , qclab::dense::SquareMatrix< T > mat2 ,
                      T* vector ) {
    assert( mat2.size() == 4 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat2 ) ;
    const T m11 = mat2( 0 , 0 ) ; const T m12 = mat2( 0 , 1 ) ;
    const T m13 = mat2( 0 , 2 ) ; const T m14 = mat2( 0 , 3 ) ;
    const T m21 = mat2( 1 , 0 ) ; const T m22 = mat2( 1 , 1 ) ;
    const T m23 = mat2( 1 , 2 ) ; const T m24 = mat2( 1 , 3 ) ;
    const T m31 = mat2( 2 , 0 ) ; const T m32 = mat2( 2 , 1 ) ;
    const T m33 = mat2( 2 , 2 ) ; const T m34 = mat2( 2 , 3 ) ;
    const T m41 = mat2( 3 , 0 ) ; const T m42 = mat2( 3 , 1 ) ;
    const T m43 = mat2( 3 , 2 ) ; const T m44 = mat2( 3 , 3 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ,
                   const uint64_t c , const uint64_t d ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      const T x3 = vector[c] ;
      const T x4 = vector[d] ;
      vector[a] = m11 * x1 + m12 * x2 + m13 * x3 + m14 * x4 ;
      vector[b] = m21 * x1 + m22 * x2 + m23 * x3 + m24 * x4 ;
      vector[c] = m31 * x1 + m32 * x2 + m33 * x3 + m34 * x4 ;
      vector[d] = m41 * x1 + m42 * x2 + m43 * x3 + m44 * x4 ;
    } ;
    return f ;
  }